

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<unsigned_long>::Matcher(Matcher<unsigned_long> *this,unsigned_long value)

{
  MatcherBase<unsigned_long> local_28;
  
  (this->super_MatcherBase<unsigned_long>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<unsigned_long>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00229150;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<unsigned_long>::
       GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::EqMatcher<unsigned_long>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00229150;
  local_28.buffer_ = (Buffer)value;
  internal::MatcherBase<unsigned_long>::operator=(&this->super_MatcherBase<unsigned_long>,&local_28)
  ;
  internal::MatcherBase<unsigned_long>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }